

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall QXmlStreamReaderPrivate::scanAfterLangleBang(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  uint uVar2;
  QXmlStreamReaderPrivate *in_RDI;
  undefined1 unaff_retaddr;
  short unaff_retaddr_00;
  char *in_stack_00000008;
  QXmlStreamReaderPrivate *in_stack_00000010;
  bool local_1;
  
  uVar2 = peekChar(in_RDI);
  switch(uVar2) {
  case 0x41:
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    break;
  default:
    local_1 = false;
    break;
  case 0x44:
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    break;
  case 0x45:
    bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr)
      ;
    }
    break;
  case 0x4e:
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    break;
  case 0x5b:
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  }
  return local_1;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAfterLangleBang()
{
    switch (peekChar()) {
    case '[':
        return scanString(spell[CDATA_START], CDATA_START, false);
    case 'D':
        return scanString(spell[DOCTYPE], DOCTYPE);
    case 'A':
        return scanString(spell[ATTLIST], ATTLIST);
    case 'N':
        return scanString(spell[NOTATION], NOTATION);
    case 'E':
        if (scanString(spell[ELEMENT], ELEMENT))
            return true;
        return scanString(spell[ENTITY], ENTITY);

    default:
        ;
    };
    return false;
}